

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void loadCubemap(char *filename)

{
  stbi_uc *retval_from_stbi_load;
  ostream *poVar1;
  char *pcVar2;
  undefined4 local_38;
  int local_34;
  GLenum format;
  int d;
  int c;
  int idx;
  uchar *pixels;
  int local_18;
  int bpp;
  int height;
  int width;
  char *filename_local;
  
  _height = filename;
  retval_from_stbi_load = stbi_load(filename,&bpp,&local_18,(int *)((long)&pixels + 4),0);
  if (retval_from_stbi_load == (stbi_uc *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Failed to load image ");
    poVar1 = std::operator<<(poVar1,_height);
    poVar1 = std::operator<<(poVar1," (");
    pcVar2 = stbi_failure_reason();
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Loaded ");
    poVar1 = std::operator<<(poVar1,_height);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = std::operator<<(poVar1,'x');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,bpp);
    poVar1 = std::operator<<(poVar1,", comp = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pixels._4_4_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    d = 0;
    for (format = 0; (int)format < 8; format = format + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        printf("%02d %02d %02d %02d  ",(ulong)retval_from_stbi_load[d],
               (ulong)retval_from_stbi_load[d + 1],(ulong)retval_from_stbi_load[d + 2],
               (ulong)retval_from_stbi_load[d + 2]);
        d = d + 4;
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if (pixels._4_4_ == 3) {
      local_38 = 0x1907;
    }
    else {
      if (pixels._4_4_ != 4) {
        poVar1 = std::operator<<((ostream *)&std::cout,"Unsupported format: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,pixels._4_4_);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        return;
      }
      local_38 = 0x1908;
    }
    glTexImage2D(0xde1,0,0x1907,bpp,local_18,0,local_38,0x1401,retval_from_stbi_load);
    (*__glewGenerateMipmap)(0xde1);
    stbi_image_free(retval_from_stbi_load);
  }
  return;
}

Assistant:

void loadCubemap(const char *filename) {
    int width, height, bpp;
    unsigned char *pixels = stbi_load(filename, &width, &height, &bpp, STBI_default);
    if (pixels == nullptr) {
        cout << "Failed to load image " << filename << " (" << stbi_failure_reason() << ")" << endl;
        return;
    }
    cout << "Loaded " << filename << ", " << height << 'x' << width << ", comp = " << bpp << endl;
    int idx = 0;
    for (int c = 0; c < 8; c++) {
        for (int d = 0; d < 4; d++) {
            printf("%02d %02d %02d %02d  ", pixels[idx], pixels[idx+1], pixels[idx+2], pixels[idx+2]);
            idx += 4;
        }
        cout << endl;
    }
    cout << "..." << endl;

    GLenum format;
    switch(bpp) {
    case STBI_rgb:
        format = GL_RGB;
        break;
    case STBI_rgb_alpha:
        format = GL_RGBA;
        break;
    default:
        cout << "Unsupported format: " << bpp << endl;
        return;
    }

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, format, GL_UNSIGNED_BYTE, pixels);
    glGenerateMipmap(GL_TEXTURE_2D);

    stbi_image_free(pixels);
}